

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UdpSocket.cpp
# Opt level: O3

void __thiscall Liby::UdpSocket::start(UdpSocket *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  Channel *this_01;
  undefined8 uVar1;
  undefined8 uVar2;
  _Any_data local_78;
  code *local_68;
  code *local_60;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  _Any_data local_30;
  code *local_20;
  code *local_18;
  
  std::__shared_ptr<Liby::UdpSocket,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Liby::UdpSocket,void>
            ((__shared_ptr<Liby::UdpSocket,(__gnu_cxx::_Lock_policy)2> *)local_78._M_pod_data,
             (__weak_ptr<Liby::UdpSocket,_(__gnu_cxx::_Lock_policy)2> *)this);
  uVar2 = local_78._8_8_;
  uVar1 = local_78._M_unused._0_8_;
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (this->self_).super___shared_ptr<Liby::UdpSocket,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->self_).super___shared_ptr<Liby::UdpSocket,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)uVar1;
  (this->self_).super___shared_ptr<Liby::UdpSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_);
    }
  }
  this_01 = (this->chan_)._M_t.
            super___uniq_ptr_impl<Liby::Channel,_std::default_delete<Liby::Channel>_>._M_t.
            super__Tuple_impl<0UL,_Liby::Channel_*,_std::default_delete<Liby::Channel>_>.
            super__Head_base<0UL,_Liby::Channel_*,_false>._M_head_impl;
  local_78._8_8_ = 0;
  local_60 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/UdpSocket.cpp:129:19)>
             ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/UdpSocket.cpp:129:19)>
             ::_M_manager;
  local_78._M_unused._M_object = this;
  std::function<void_()>::operator=(&this_01->readEventCallback_,(function<void_()> *)&local_78);
  local_30._8_8_ = 0;
  local_18 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/UdpSocket.cpp:130:17)>
             ::_M_invoke;
  local_20 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/UdpSocket.cpp:130:17)>
             ::_M_manager;
  local_30._M_unused._M_object = this;
  std::function<void_()>::operator=(&this_01->writEventCallback_,(function<void_()> *)&local_30);
  local_50._8_8_ = 0;
  local_38 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/UdpSocket.cpp:131:17)>
             ::_M_invoke;
  local_40 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/UdpSocket.cpp:131:17)>
             ::_M_manager;
  local_50._M_unused._M_object = this;
  std::function<void_()>::operator=(&this_01->erroEventCallback_,(function<void_()> *)&local_50);
  this_01->readable_ = true;
  Channel::addChannel(this_01);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  if (local_20 != (code *)0x0) {
    (*local_20)(&local_30,&local_30,__destroy_functor);
  }
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  return;
}

Assistant:

void UdpSocket::start() {
    self_ = shared_from_this();
    chan_->onRead([this] { handleReadEvent(); })
        .onWrit([this] { handleWritEvent(); })
        .onErro([this] { handleErroEvent(); })
        .enableRead()
        .addChannel();
}